

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

uint32 __thiscall osc::ReceivedMessageArgument::AsRgbaColor(ReceivedMessageArgument *this)

{
  uint32 uVar1;
  MissingArgumentException *this_00;
  WrongArgumentTypeException *this_01;
  ReceivedMessageArgument *this_local;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    this_00 = (MissingArgumentException *)__cxa_allocate_exception(0x10);
    MissingArgumentException::MissingArgumentException(this_00,"missing argument");
    __cxa_throw(this_00,&MissingArgumentException::typeinfo,
                MissingArgumentException::~MissingArgumentException);
  }
  if (*this->typeTagPtr_ == 'r') {
    uVar1 = AsRgbaColorUnchecked(this);
    return uVar1;
  }
  this_01 = (WrongArgumentTypeException *)__cxa_allocate_exception(0x10);
  WrongArgumentTypeException::WrongArgumentTypeException(this_01,"wrong argument type");
  __cxa_throw(this_01,&WrongArgumentTypeException::typeinfo,
              WrongArgumentTypeException::~WrongArgumentTypeException);
}

Assistant:

uint32 ReceivedMessageArgument::AsRgbaColor() const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == RGBA_COLOR_TYPE_TAG )
		return AsRgbaColorUnchecked();
	else
		throw WrongArgumentTypeException();
}